

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

void advance_engine<trng::yarn3s>(yarn3s *r1,long N)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  if (0 < N) {
    iVar5 = (r1->S).r[0];
    iVar4 = (r1->S).r[1];
    iVar2 = (r1->S).r[2];
    do {
      iVar1 = iVar4;
      iVar4 = iVar5;
      uVar3 = (long)iVar2 * (long)(r1->P).a[2] +
              (long)iVar1 * (long)(r1->P).a[1] + (long)iVar4 * (long)(r1->P).a[0];
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      iVar2 = (int)uVar3;
      iVar5 = iVar2 + -0x7fffadb3;
      if (uVar3 < 0x7fffadb3) {
        iVar5 = iVar2;
      }
      N = N + -1;
      iVar2 = iVar1;
    } while (N != 0);
    (r1->S).r[0] = iVar5;
    (r1->S).r[1] = iVar4;
    (r1->S).r[2] = iVar1;
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}